

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

void __thiscall despot::option::Option::append(Option *this,Option *new_last)

{
  Option *pOVar1;
  Option *ptr;
  Option *f;
  Option *p;
  Option *new_last_local;
  Option *this_local;
  
  pOVar1 = last(this);
  ptr = first(this);
  pOVar1->next_ = new_last;
  new_last->prev_ = pOVar1;
  pOVar1 = tag(ptr);
  new_last->next_ = pOVar1;
  pOVar1 = tag(new_last);
  ptr->prev_ = pOVar1;
  return;
}

Assistant:

void append(Option* new_last) {
		Option* p = last();
		Option* f = first();
		p->next_ = new_last;
		new_last->prev_ = p;
		new_last->next_ = tag(f);
		f->prev_ = tag(new_last);
	}